

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_epoll.c
# Opt level: O0

void epoll_poll(ev_loop *loop,ev_tstamp timeout)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  epoll_event *__event;
  epoll_event *peVar8;
  uchar events;
  int fd_1;
  int got;
  int want;
  int fd;
  epoll_event *ev;
  int eventcnt;
  int i;
  ev_tstamp timeout_local;
  ev_loop *loop_local;
  
  _eventcnt = timeout;
  if (loop->epoll_epermcnt != 0) {
    _eventcnt = 0.0;
  }
  if (loop->release_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->release_cb)(loop);
  }
  iVar2 = epoll_wait(loop->backend_fd,(epoll_event *)loop->epoll_events,loop->epoll_eventmax,
                     (int)(_eventcnt * 1000.0));
  if (loop->acquire_cb != (_func_void_ev_loop_ptr *)0x0) {
    (*loop->acquire_cb)(loop);
  }
  if (iVar2 < 0) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      ev_syserr("(libev) epoll_wait");
    }
  }
  else {
    for (ev._4_4_ = 0; ev._4_4_ < iVar2; ev._4_4_ = ev._4_4_ + 1) {
      __event = (epoll_event *)(loop->epoll_events + ev._4_4_);
      iVar3 = (int)*(undefined8 *)&__event->field_0x4;
      bVar1 = loop->anfds[iVar3].events;
      uVar4 = 0;
      if ((__event->events & 0x1c) != 0) {
        uVar4 = 2;
      }
      uVar4 = uVar4 | (__event->events & 0x19) != 0;
      if (loop->anfds[iVar3].egen == (uint)((ulong)*(undefined8 *)&__event->field_0x4 >> 0x20)) {
        if ((uVar4 & (bVar1 ^ 0xffffffff)) != 0) {
          loop->anfds[iVar3].emask = bVar1;
          uVar5 = 0;
          if ((bVar1 & 2) != 0) {
            uVar5 = 4;
          }
          __event->events = (bVar1 & 1) != 0 | uVar5;
          iVar6 = 2;
          if (bVar1 != 0) {
            iVar6 = 3;
          }
          iVar6 = epoll_ctl(loop->backend_fd,iVar6,iVar3,__event);
          if (iVar6 != 0) {
            loop->postfork = loop->postfork | 2;
            goto LAB_0010d176;
          }
        }
        fd_event(loop,iVar3,uVar4);
      }
      else {
        loop->postfork = loop->postfork | 2;
      }
LAB_0010d176:
    }
    if (iVar2 == loop->epoll_eventmax) {
      ev_realloc(loop->epoll_events,0);
      iVar2 = array_nextsize(0xc,loop->epoll_eventmax,loop->epoll_eventmax + 1);
      loop->epoll_eventmax = iVar2;
      peVar8 = (epoll_event *)ev_realloc((void *)0x0,(long)loop->epoll_eventmax * 0xc);
      loop->epoll_events = peVar8;
    }
    ev._4_4_ = loop->epoll_epermcnt;
    while (iVar2 = ev._4_4_ + -1, ev._4_4_ != 0) {
      iVar3 = loop->epoll_eperms[iVar2];
      bVar1 = loop->anfds[iVar3].events & 3;
      ev._4_4_ = iVar2;
      if (((loop->anfds[iVar3].emask & 0x80) == 0) || (bVar1 == 0)) {
        iVar6 = loop->epoll_epermcnt + -1;
        loop->epoll_epermcnt = iVar6;
        loop->epoll_eperms[iVar2] = loop->epoll_eperms[iVar6];
        loop->anfds[iVar3].emask = '\0';
      }
      else {
        fd_event(loop,iVar3,(uint)bVar1);
      }
    }
  }
  return;
}

Assistant:

static void
epoll_poll (EV_P_ ev_tstamp timeout)
{
  int i;
  int eventcnt;

  if (expect_false (epoll_epermcnt))
    timeout = 0.;

  /* epoll wait times cannot be larger than (LONG_MAX - 999UL) / HZ msecs, which is below */
  /* the default libev max wait time, however. */
  EV_RELEASE_CB;
  eventcnt = epoll_wait (backend_fd, epoll_events, epoll_eventmax, timeout * 1e3);
  EV_ACQUIRE_CB;

  if (expect_false (eventcnt < 0))
    {
      if (errno != EINTR)
        ev_syserr ("(libev) epoll_wait");

      return;
    }

  for (i = 0; i < eventcnt; ++i)
    {
      struct epoll_event *ev = epoll_events + i;

      int fd = (uint32_t)ev->data.u64; /* mask out the lower 32 bits */
      int want = anfds [fd].events;
      int got  = (ev->events & (EPOLLOUT | EPOLLERR | EPOLLHUP) ? EV_WRITE : 0)
               | (ev->events & (EPOLLIN  | EPOLLERR | EPOLLHUP) ? EV_READ  : 0);

      /*
       * check for spurious notification.
       * this only finds spurious notifications on egen updates
       * other spurious notifications will be found by epoll_ctl, below
       * we assume that fd is always in range, as we never shrink the anfds array
       */
      if (expect_false ((uint32_t)anfds [fd].egen != (uint32_t)(ev->data.u64 >> 32)))
        {
          /* recreate kernel state */
          postfork |= 2;
          continue;
        }

      if (expect_false (got & ~want))
        {
          anfds [fd].emask = want;

          /*
           * we received an event but are not interested in it, try mod or del
           * this often happens because we optimistically do not unregister fds
           * when we are no longer interested in them, but also when we get spurious
           * notifications for fds from another process. this is partially handled
           * above with the gencounter check (== our fd is not the event fd), and
           * partially here, when epoll_ctl returns an error (== a child has the fd
           * but we closed it).
           */
          ev->events = (want & EV_READ  ? EPOLLIN  : 0)
                     | (want & EV_WRITE ? EPOLLOUT : 0);

          /* pre-2.6.9 kernels require a non-null pointer with EPOLL_CTL_DEL, */
          /* which is fortunately easy to do for us. */
          if (epoll_ctl (backend_fd, want ? EPOLL_CTL_MOD : EPOLL_CTL_DEL, fd, ev))
            {
              postfork |= 2; /* an error occurred, recreate kernel state */
              continue;
            }
        }

      fd_event (EV_A_ fd, got);
    }

  /* if the receive array was full, increase its size */
  if (expect_false (eventcnt == epoll_eventmax))
    {
      ev_free (epoll_events);
      epoll_eventmax = array_nextsize (sizeof (struct epoll_event), epoll_eventmax, epoll_eventmax + 1);
      epoll_events = (struct epoll_event *)ev_malloc (sizeof (struct epoll_event) * epoll_eventmax);
    }

  /* now synthesize events for all fds where epoll fails, while select works... */
  for (i = epoll_epermcnt; i--; )
    {
      int fd = epoll_eperms [i];
      unsigned char events = anfds [fd].events & (EV_READ | EV_WRITE);

      if (anfds [fd].emask & EV_EMASK_EPERM && events)
        fd_event (EV_A_ fd, events);
      else
        {
          epoll_eperms [i] = epoll_eperms [--epoll_epermcnt];
          anfds [fd].emask = 0;
        }
    }
}